

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O3

void __thiscall QtMWidgets::BusyIndicator::setRunning(BusyIndicator *this,bool on)

{
  BusyIndicatorPrivate *pBVar1;
  
  pBVar1 = (this->d).d;
  if (pBVar1->running == on) {
    return;
  }
  pBVar1->running = on;
  if (on) {
    QWidget::show();
    QAbstractAnimation::start(((this->d).d)->animation,0);
    return;
  }
  QWidget::hide();
  QAbstractAnimation::stop();
  return;
}

Assistant:

void
BusyIndicator::setRadius( int r )
{
	if( d->outerRadius != r )
	{
		d->outerRadius = r;
		d->innerRadius = d->outerRadius * 0.6;
		d->size = QSize( d->outerRadius * 2, d->outerRadius * 2 );

		updateGeometry();
	}
}